

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lex.c
# Opt level: O0

uint32 trans_hash_fn(ScanStateTransition *a,hash_fns_t *fns)

{
  uint local_20;
  uint32 local_1c;
  uint i;
  uint h;
  hash_fns_t *fns_local;
  ScanStateTransition *a_local;
  
  local_1c = 0;
  if (fns->data[0] == (void *)0x0) {
    for (local_20 = 0; local_20 < (a->live_diff).n; local_20 = local_20 + 1) {
      local_1c = (a->live_diff).v[local_20]->index * 3 + local_1c;
    }
  }
  for (local_20 = 0; local_20 < (a->accepts_diff).n; local_20 = local_20 + 1) {
    local_1c = (a->accepts_diff).v[local_20]->index * 3 + local_1c;
  }
  return local_1c;
}

Assistant:

static uint32 trans_hash_fn(ScanStateTransition *a, hash_fns_t *fns) {
  uint h = 0, i;

  if (!fns->data[0])
    for (i = 0; i < a->live_diff.n; i++) h += 3 * a->live_diff.v[i]->index;
  for (i = 0; i < a->accepts_diff.n; i++) h += 3 * a->accepts_diff.v[i]->index;
  return h;
}